

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_object.cpp
# Opt level: O1

void graphics_create(Am_Object *gr_object)

{
  bool in_visible;
  int in_left;
  int in_top;
  int in_width;
  int in_height;
  Am_State_Store *this;
  Am_Value *pAVar1;
  Am_Object local_40;
  Am_Object local_38;
  
  this = (Am_State_Store *)operator_new(0x30);
  Am_Object::Am_Object(&local_38,gr_object);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)gr_object,10);
  pAVar1 = Am_Object::Get(gr_object,0x69,3);
  in_visible = Am_Value::operator_cast_to_bool(pAVar1);
  pAVar1 = Am_Object::Get(gr_object,100,3);
  in_left = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = Am_Object::Get(gr_object,0x65,3);
  in_top = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = Am_Object::Get(gr_object,0x66,3);
  in_width = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = Am_Object::Get(gr_object,0x67,3);
  in_height = Am_Value::operator_cast_to_int(pAVar1);
  Am_State_Store::Am_State_Store
            (this,&local_38,&local_40,in_visible,in_left,in_top,in_width,in_height);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Set(gr_object,0x7d8,this,1);
  return;
}

Assistant:

void
graphics_create(Am_Object gr_object)
{
  Am_State_Store *state =
      new Am_State_Store(gr_object, gr_object.Get_Owner(),
                         gr_object.Get(Am_VISIBLE, Am_RETURN_ZERO_ON_ERROR),
                         gr_object.Get(Am_LEFT, Am_RETURN_ZERO_ON_ERROR),
                         gr_object.Get(Am_TOP, Am_RETURN_ZERO_ON_ERROR),
                         gr_object.Get(Am_WIDTH, Am_RETURN_ZERO_ON_ERROR),
                         gr_object.Get(Am_HEIGHT, Am_RETURN_ZERO_ON_ERROR));
  gr_object.Set(Am_PREV_STATE, (Am_Ptr)state, Am_OK_IF_NOT_THERE);
}